

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTables.h
# Opt level: O3

void __thiscall CTables::calcOrientationTable(CTables *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int **ppiVar5;
  double **ppdVar6;
  int *piVar7;
  double *pdVar8;
  int x;
  int iVar9;
  long lVar10;
  int y;
  int iVar11;
  long lVar12;
  double dVar13;
  
  ppiVar5 = (int **)operator_new__(0xff8);
  this->orientationFullTable = ppiVar5;
  ppiVar5 = (int **)operator_new__(0xff8);
  this->orientationHalfTable = ppiVar5;
  ppdVar6 = (double **)operator_new__(0xff8);
  this->magnitudeTable = ppdVar6;
  iVar1 = this->oriFull;
  iVar2 = this->oriHalf;
  iVar3 = this->numOriFull;
  iVar4 = this->numOriHalf;
  lVar12 = -0xff;
  do {
    piVar7 = (int *)operator_new__(0x7fc);
    this->orientationFullTable[lVar12 + 0xff] = piVar7;
    piVar7 = (int *)operator_new__(0x7fc);
    this->orientationHalfTable[lVar12 + 0xff] = piVar7;
    pdVar8 = (double *)operator_new__(0xff8);
    iVar11 = (int)lVar12;
    this->magnitudeTable[lVar12 + 0xff] = pdVar8;
    lVar10 = -0xff;
    do {
      iVar9 = (int)lVar10;
      dVar13 = atan2((double)iVar11,(double)iVar9);
      this->orientationFullTable[lVar12 + 0xff][lVar10 + 0xff] =
           (int)((double)(((int)((dVar13 / 3.141592653589793) * 180.0) + 0x168) % this->oriFull) /
                (double)(iVar1 / iVar3));
      dVar13 = atan2((double)iVar11,(double)iVar9);
      this->orientationHalfTable[lVar12 + 0xff][lVar10 + 0xff] =
           (int)((double)(((int)((dVar13 / 3.141592653589793) * 180.0) + 0x168) % this->oriHalf) /
                (double)(iVar2 / iVar4));
      this->magnitudeTable[lVar12 + 0xff][lVar10 + 0xff] =
           (double)SQRT((float)(iVar9 * iVar9 + iVar11 * iVar11));
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x100);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ori and magn table created",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void CTables::calcOrientationTable()
{
    orientationFullTable = new int*[NUM_DIFF];
    orientationHalfTable = new int*[NUM_DIFF];
    magnitudeTable = new double*[NUM_DIFF];
    double intervalFull = oriFull/numOriFull;
    double intervalHalf = oriHalf/numOriHalf;
    for(int y=-255; y<=255; y++)
    {
        orientationFullTable[y+255] = new int[NUM_DIFF];
        orientationHalfTable[y+255] = new int[NUM_DIFF];
        magnitudeTable[y+255] = new double[NUM_DIFF];
        for(int x=-255; x<=255; x++)
        {
            orientationFullTable[y+255][x+255] = (((int)arcTan(x, y)+360)%oriFull)/intervalFull;
            orientationHalfTable[y+255][x+255] = (((int)arcTan(x, y)+360)%oriHalf)/intervalHalf;
            magnitudeTable[y+255][x+255] = sqrtf(x*x + y*y);
        }
    }
    cout<<"ori and magn table created"<<endl;
}